

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_integrand_quad_err2(void *void_node_area,REF_DBL *bary,REF_DBL *error)

{
  double dVar1;
  double local_130;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT p;
  REF_DBL linear;
  REF_DBL quadratic;
  REF_INT i;
  REF_DBL shape [27];
  REF_DBL *node_area;
  REF_DBL *error_local;
  REF_DBL *bary_local;
  void *void_node_area_local;
  
  shape[0x1a] = (REF_DBL)void_node_area;
  void_node_area_local._4_4_ = ref_cell_shape(REF_CELL_TR3,bary,(REF_DBL *)&stack0xfffffffffffffef8)
  ;
  if (void_node_area_local._4_4_ == 0) {
    linear = 0.0;
    for (quadratic._4_4_ = 0; quadratic._4_4_ < 6; quadratic._4_4_ = quadratic._4_4_ + 1) {
      linear = shape[(long)quadratic._4_4_ + -1] *
               *(double *)((long)shape[0x1a] + (long)quadratic._4_4_ * 8) + linear;
    }
    _ref_private_macro_code_rss = 0.0;
    for (quadratic._4_4_ = 0; quadratic._4_4_ < 3; quadratic._4_4_ = quadratic._4_4_ + 1) {
      _ref_private_macro_code_rss =
           bary[quadratic._4_4_] * *(double *)((long)shape[0x1a] + (long)quadratic._4_4_ * 8) +
           _ref_private_macro_code_rss;
    }
    if (linear - _ref_private_macro_code_rss <= 0.0) {
      local_130 = -(linear - _ref_private_macro_code_rss);
    }
    else {
      local_130 = linear - _ref_private_macro_code_rss;
    }
    dVar1 = pow(local_130,1.0);
    *error = dVar1 * *(double *)((long)shape[0x1a] + 0x30);
    void_node_area_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe84,
           "ref_metric_integrand_quad_err2",(ulong)void_node_area_local._4_4_,"shape");
  }
  return void_node_area_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_integrand_quad_err2(void *void_node_area,
                                                         REF_DBL *bary,
                                                         REF_DBL *error) {
  REF_DBL *node_area = (REF_DBL *)void_node_area;
  REF_DBL shape[REF_CELL_MAX_SIZE_PER];
  REF_INT i;
  REF_DBL quadratic, linear;
  REF_INT p = 1;

  RSS(ref_cell_shape(REF_CELL_TR3, bary, shape), "shape");

  quadratic = 0.0;
  for (i = 0; i < 6; i++) {
    quadratic += shape[i] * node_area[i];
  }
  linear = 0.0;
  for (i = 0; i < 3; i++) {
    linear += bary[i] * node_area[i];
  }
  *error = pow(ABS(quadratic - linear), p) * node_area[6];
  return REF_SUCCESS;
}